

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threading-c.cpp
# Opt level: O1

void duckdb_execute_tasks_state(duckdb_task_state state_p)

{
  TaskScheduler *this;
  
  if (state_p != (duckdb_task_state)0x0) {
    this = duckdb::TaskScheduler::GetScheduler(*state_p);
    LOCK();
    *(long *)((long)state_p + 0x10) = *(long *)((long)state_p + 0x10) + 1;
    UNLOCK();
    duckdb::TaskScheduler::ExecuteForever(this,*(atomic<bool> **)((long)state_p + 8));
    return;
  }
  return;
}

Assistant:

void duckdb_execute_tasks_state(duckdb_task_state state_p) {
	if (!state_p) {
		return;
	}
	auto state = (CAPITaskState *)state_p;
	auto &scheduler = duckdb::TaskScheduler::GetScheduler(state->db);
	state->execute_count++;
	scheduler.ExecuteForever(state->marker.get());
}